

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool __thiscall
slang::CommandLine::parse
          (CommandLine *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          args,ParseOptions options)

{
  bool bVar1;
  Option *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pbVar4;
  CommandLine *pCVar5;
  int iVar6;
  path *ppVar7;
  undefined4 extraout_var;
  void *pvVar8;
  iterator iVar9;
  iterator iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  runtime_error *this_01;
  path *ppVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  ulong __n;
  _Rb_tree_color _Var15;
  size_type __rlen;
  basic_string_view<char,_std::char_traits<char>_> *__source;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 __s1;
  long lVar16;
  __extent_storage<18446744073709551615UL> _Var17;
  string_view *psVar18;
  string_view arg;
  string_view sVar19;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  bool hadUnknowns;
  string result;
  Option *expectingVal;
  string lookupStr;
  string expectingValName;
  char local_149;
  CommandLine *local_148;
  string local_140;
  Option *local_120;
  ParseOptions local_118;
  uint local_114;
  bool *local_110;
  ulong local_108;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_100;
  path local_f8;
  string local_d0;
  path local_b0;
  _Base_ptr local_88;
  ulong local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  _Var17 = args._M_extent._M_extent_value;
  __source = args._M_ptr;
  local_148 = this;
  if ((this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"No options defined");
LAB_0073ba5d:
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((uint)options >> 8 & 1) != 0) goto LAB_0073b3c1;
  if (_Var17._M_extent_value == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Expected at least one argument");
    goto LAB_0073ba5d;
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_b0,__source,auto_format);
  if (local_b0._M_pathname._M_string_length == 0) {
LAB_0073b383:
    std::filesystem::__cxx11::path::path(&local_f8);
  }
  else {
    ppVar7 = &local_b0;
    if ((~(byte)local_b0._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl & 3) != 0) {
      if ((((ulong)local_b0._M_cmpts._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) &&
         (local_b0._M_pathname._M_dataplus._M_p[local_b0._M_pathname._M_string_length - 1] != '/'))
      {
        if (((ulong)local_b0._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) == 0) {
          ppVar7 = (path *)std::filesystem::__cxx11::path::_List::end();
        }
        else {
          ppVar7 = (path *)0x0;
        }
        ppVar12 = (path *)&ppVar7[-2]._M_cmpts;
        if (((ulong)local_b0._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) != 0) {
          ppVar12 = ppVar7;
        }
        ppVar7 = &local_b0;
        if (((ulong)local_b0._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) == 0) {
          ppVar7 = ppVar12;
        }
        if ((~*(uint *)&(ppVar7->_M_cmpts)._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t & 3) == 0) {
          ppVar7 = &local_b0;
          if (((ulong)local_b0._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) == 0) {
            ppVar7 = ppVar12;
          }
          goto LAB_0073b374;
        }
      }
      goto LAB_0073b383;
    }
LAB_0073b374:
    std::filesystem::__cxx11::path::path(&local_f8,ppVar7);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_148->programName,&local_f8._M_pathname);
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::filesystem::__cxx11::path::~path(&local_b0);
  _Var17._M_extent_value = _Var17._M_extent_value - 1;
  __source = __source + 1;
LAB_0073b3c1:
  uVar14 = 0;
  local_120 = (Option *)0x0;
  local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
  local_b0._M_pathname._M_string_length = 0;
  local_b0._M_pathname.field_2._M_local_buf[0] = '\0';
  local_149 = '\0';
  if (_Var17._M_extent_value == 0) {
    local_100.values_ = (value<fmt::v11::context> *)0x0;
  }
  else {
    local_114 = (uint)options >> 0x18;
    psVar18 = __source + _Var17._M_extent_value;
    local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_148->errors;
    local_60 = &local_148->cmdIgnore;
    local_88 = &(local_148->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = &local_148->cmdRename;
    local_70 = &(local_148->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_80 = 0;
    _Var15 = _S_red;
    local_100.values_ = (value<fmt::v11::context> *)0x0;
    uVar14 = 0;
    local_118 = options;
    do {
      if (_Var15 == _S_red) {
        __n = __source->_M_len;
        __s1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)__source->_M_str;
        sVar19 = *__source;
        if (local_120 == (Option *)0x0) {
          local_108 = uVar14;
          if (((__n < 2) || ((local_80 & 1) != 0)) ||
             ((bVar1 = ((__s1.values_)->field_0).bool_value, bVar1 != true && (bVar1 != true)))) {
            if (uVar14 == 0) {
              uVar14 = __n;
              local_100 = __s1;
            }
            this_00 = (local_148->positional).
                      super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            _Var15 = _S_red;
            if ((this_00 != (Option *)0x0) &&
               (Option::set_abi_cxx11_
                          (&local_50,this_00,(string_view)(ZEXT816(0xa04334) << 0x40),*__source,
                           (bool)((byte)local_114 & 1)), in_R9 = __s1,
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50._M_dataplus._M_p != &local_50.field_2)) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
              in_R9 = __s1;
              _Var15 = _S_red;
            }
          }
          else {
            if (__n == 2) {
              iVar6 = bcmp(__s1.values_,"--",2);
              if (iVar6 == 0) {
                local_80 = CONCAT71((int7)(CONCAT44(extraout_var,iVar6) >> 8),1);
                _Var15 = _S_red;
                uVar14 = local_108;
                goto LAB_0073b55a;
              }
            }
            _Var15 = _S_red;
            if ((local_148->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
                (local_148->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              if (bVar1 == true) {
                pvVar8 = memchr((bool *)((long)&(__s1.values_)->field_0 + 1),0x2b,__n - 1);
                uVar14 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)__s1;
                if (uVar14 != 0xffffffffffffffff) {
                  if (__n < uVar14) {
                    std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > __size (which is %zu)",
                               "basic_string_view::substr",uVar14,__n);
                  }
                  goto LAB_0073b6fc;
                }
LAB_0073b6ce:
                lVar16 = 0;
                local_110 = (bool *)0x0;
              }
              else {
                pvVar8 = memchr(__s1.values_,0x3d,__n);
                uVar14 = (long)pvVar8 - (long)__s1;
                if (uVar14 == 0xffffffffffffffff || pvVar8 == (void *)0x0) goto LAB_0073b6ce;
                if (__n < uVar14) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",uVar14,__n);
                }
LAB_0073b6fc:
                lVar16 = __n - uVar14;
                local_110 = (bool *)((long)&(__s1.values_)->field_0 + uVar14);
                __n = uVar14;
              }
              local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,__s1.values_,
                         (bool *)((long)&(__s1.values_)->field_0 + __n));
              iVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&local_60->_M_t,&local_f8._M_pathname);
              if (iVar9._M_node == local_88) {
                _Var15 = _S_red;
                iVar10 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::find(&local_68->_M_t,&local_f8._M_pathname);
                if (iVar10._M_node == local_70) {
                  iVar6 = 0;
                }
                else {
                  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                  local_78 = iVar10._M_node;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_d0,local_110,local_110 + lVar16);
                  pbVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_d0,0,0,*(char **)(local_78 + 2),
                                    (size_type)local_78[2]._M_parent);
                  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar11->_M_dataplus)._M_p;
                  paVar13 = &pbVar11->field_2;
                  if (paVar2 == paVar13) {
                    local_140.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                  }
                  else {
                    local_140.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_140._M_dataplus._M_p = (pointer)paVar2;
                  }
                  local_140._M_string_length = pbVar11->_M_string_length;
                  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar11->_M_string_length = 0;
                  (pbVar11->field_2)._M_local_buf[0] = '\0';
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                  in_R9.values_ = (value<fmt::v11::context> *)&local_149;
                  arg._M_str = local_140._M_dataplus._M_p;
                  arg._M_len = local_140._M_string_length;
                  handleArg(local_148,arg,&local_120,&local_b0._M_pathname,(bool *)in_R9.values_,
                            local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                    operator_delete(local_140._M_dataplus._M_p,
                                    local_140.field_2._M_allocated_capacity + 1);
                  }
                  iVar6 = 3;
                }
              }
              else {
                _Var15 = iVar9._M_node[2]._M_color;
                iVar6 = 3;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_pathname._M_dataplus._M_p != &local_f8._M_pathname.field_2) {
                operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                                (size_t)(local_f8._M_pathname.field_2._M_allocated_capacity + 1));
              }
              uVar14 = local_108;
              if (iVar6 != 0) goto LAB_0073b55a;
            }
            in_R9.values_ = (value<fmt::v11::context> *)&local_149;
            handleArg(local_148,sVar19,&local_120,&local_b0._M_pathname,(bool *)in_R9.values_,
                      local_118);
            uVar14 = local_108;
          }
        }
        else {
          sVar19._M_str = local_b0._M_pathname._M_dataplus._M_p;
          sVar19._M_len = local_b0._M_pathname._M_string_length;
          Option::set_abi_cxx11_(&local_140,local_120,sVar19,*__source,(bool)((byte)local_114 & 1));
          if (local_140._M_string_length != 0) {
            local_f8._M_pathname._M_dataplus._M_p = (local_148->programName)._M_dataplus._M_p;
            local_f8._M_pathname._M_string_length = (local_148->programName)._M_string_length;
            local_f8._M_pathname.field_2._M_allocated_capacity =
                 (size_type)local_140._M_dataplus._M_p;
            local_f8._M_pathname.field_2._8_8_ = local_140._M_string_length;
            fmt.size_ = 0xdd;
            fmt.data_ = (char *)0x6;
            args_00.field_1.args_ = __s1.args_;
            args_00.desc_ = (unsigned_long_long)&local_f8;
            ::fmt::v11::vformat_abi_cxx11_(&local_d0,(v11 *)"{}: {}",fmt,args_00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_58,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
          }
          local_120 = (Option *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          in_R9 = __s1;
          _Var15 = _S_red;
        }
      }
      else {
        _Var15 = _Var15 - _S_black;
      }
LAB_0073b55a:
      __source = __source + 1;
    } while (__source != psVar18);
  }
  pCVar5 = local_148;
  if (local_120 != (Option *)0x0) {
    local_f8._M_pathname._M_dataplus._M_p = (local_148->programName)._M_dataplus._M_p;
    local_f8._M_pathname._M_string_length = (local_148->programName)._M_string_length;
    local_f8._M_pathname.field_2._M_allocated_capacity =
         (size_type)local_b0._M_pathname._M_dataplus._M_p;
    local_f8._M_pathname.field_2._8_8_ = local_b0._M_pathname._M_string_length;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x27;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_f8;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_140,(v11 *)"{}: no value provided for argument \'{}\'",fmt_00,args_01);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pCVar5->errors,
               &local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((pCVar5->positional).
        super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) && (uVar14 != 0)) && (local_149 == '\0')) {
    local_f8._M_pathname._M_dataplus._M_p = (pCVar5->programName)._M_dataplus._M_p;
    local_f8._M_pathname._M_string_length = (pCVar5->programName)._M_string_length;
    local_f8._M_pathname.field_2._M_allocated_capacity = (size_type)local_100;
    fmt_01.size_ = 0xdd;
    fmt_01.data_ = (char *)0x38;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)&local_f8;
    local_f8._M_pathname.field_2._8_8_ = uVar14;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_140,(v11 *)"{}: positional arguments are not allowed (see e.g. \'{}\')",fmt_01
               ,args_02);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pCVar5->errors,
               &local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar3 = (pCVar5->errors).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pCVar5->errors).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
    operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_b0._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_b0._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  return pbVar3 == pbVar4;
}

Assistant:

bool CommandLine::parse(std::span<const std::string_view> args, ParseOptions options) {
    if (optionMap.empty())
        SLANG_THROW(std::runtime_error("No options defined"));

    if (!options.ignoreProgramName) {
        if (args.empty())
            SLANG_THROW(std::runtime_error("Expected at least one argument"));

        programName = getU8Str(fs::path(args[0]).filename());
        args = args.subspan(1);
    }

    Option* expectingVal = nullptr;
    std::string expectingValName;
    bool doubleDash = false;
    bool hadUnknowns = false;
    std::string_view firstPositional;

    int skip = 0;
    for (auto arg : args) {
        // Skip N arguments if needed (set by the cmdIgnore feature).
        if (skip) {
            skip--;
            continue;
        }

        // If we were previously expecting a value, set that now.
        if (expectingVal) {
            std::string result = expectingVal->set(expectingValName, arg, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));

            expectingVal = nullptr;
            continue;
        }

        // This is a positional argument if:
        // - Doesn't start with '-' and '+'
        // - Is exactly '-'
        // - Or we've seen a double dash already
        if (arg.length() <= 1 || doubleDash || (arg[0] != '-' && arg[0] != '+')) {
            if (firstPositional.empty())
                firstPositional = arg;

            if (positional)
                positional->set(""sv, arg, options.ignoreDuplicates);

            continue;
        }

        // Double dash indicates that all further arguments are positional.
        if (arg == "--"sv) {
            doubleDash = true;
            continue;
        }

        // Check if arg is in the list of commands to skip or translate.
        if (!cmdIgnore.empty() || !cmdRename.empty()) {
            std::string_view ignoreArg = arg;
            std::string_view remainder;
            if (arg[0] == '+') {
                // If we ignore a vendor command of the form +xx ,
                // we match on any +xx+yyy command as +yy is the command's argument.
                size_t plusIndex = arg.find_first_of('+', 1);
                if (plusIndex != std::string_view::npos) {
                    ignoreArg = arg.substr(0, plusIndex);
                    remainder = arg.substr(plusIndex);
                }
            }
            else {
                // Otherwise we look up to the first equals for the name to ignore.
                size_t equalsIndex = arg.find_first_of('=');
                if (equalsIndex != std::string_view::npos) {
                    ignoreArg = arg.substr(0, equalsIndex);
                    remainder = arg.substr(equalsIndex);
                }
            }

            auto lookupStr = std::string(ignoreArg);
            if (auto it = cmdIgnore.find(lookupStr); it != cmdIgnore.end()) {
                // If yes, find how many args to skip.
                skip = it->second;
                continue;
            }

            if (auto it = cmdRename.find(lookupStr); it != cmdRename.end()) {
                // If yes, rename argument.
                auto renamed = it->second + std::string(remainder);
                handleArg(renamed, expectingVal, expectingValName, hadUnknowns, options);
                continue;
            }
        }

        // Otherwise just handle the argument.
        handleArg(arg, expectingVal, expectingValName, hadUnknowns, options);
    }

    if (expectingVal) {
        errors.emplace_back(fmt::format("{}: no value provided for argument '{}'"sv, programName,
                                        expectingValName));
    }

    if (!positional && !firstPositional.empty() && !hadUnknowns) {
        errors.emplace_back(
            fmt::format("{}: positional arguments are not allowed (see e.g. '{}')"sv, programName,
                        firstPositional));
    }

    return errors.empty();
}